

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::Coroutine<kj::HttpInputStream::Message>::fulfill
          (Coroutine<kj::HttpInputStream::Message> *this,
          FixVoid<kj::HttpInputStream::Message> *value)

{
  bool bVar1;
  Message *value_00;
  ExceptionOr<kj::HttpInputStream::Message> local_1d0;
  Message *local_18;
  FixVoid<kj::HttpInputStream::Message> *value_local;
  Coroutine<kj::HttpInputStream::Message> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<kj::HttpInputStream::Message> *)this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::HttpInputStream::Message>(local_18);
    ExceptionOr<kj::HttpInputStream::Message>::ExceptionOr(&local_1d0,value_00);
    ExceptionOr<kj::HttpInputStream::Message>::operator=(&this->result,&local_1d0);
    ExceptionOr<kj::HttpInputStream::Message>::~ExceptionOr(&local_1d0);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }